

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymLocal * __thiscall
CTcPrsSymtab::add_formal(CTcPrsSymtab *this,textchar_t *sym,size_t len,int formal_num,int copy_str)

{
  long lVar1;
  ulong in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  CTcSymLocal *lcl;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  CTcSymLocal *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  lVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI,in_RDX);
  if (lVar1 == 0) {
    local_8 = (CTcSymLocal *)CTcSymbolBase::operator_new(0x2ae139);
    CTcSymLocal::CTcSymLocal
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)local_8 >> 0x20));
    (**(code **)(*in_RDI + 0x18))(in_RDI,local_8);
  }
  else {
    CTcTokenizer::log_error(0x2b1f,in_RDX & 0xffffffff,in_RSI);
    local_8 = (CTcSymLocal *)0x0;
  }
  return local_8;
}

Assistant:

CTcSymLocal *CTcPrsSymtab::add_formal(const textchar_t *sym, size_t len,
                                      int formal_num, int copy_str)
{
    CTcSymLocal *lcl;
    
    /* 
     *   Make sure it's not already defined in our own symbol table - if
     *   it is, log an error and ignore the redundant definition.  (We
     *   only care about our own scope, not enclosing scopes, since it's
     *   perfectly fine to hide variables in enclosing scopes.)  
     */
    if (find_direct(sym, len) != 0)
    {
        /* log an error */
        G_tok->log_error(TCERR_FORMAL_REDEF, (int)len, sym);

        /* don't add the symbol again */
        return 0;
    }

    /* create the symbol entry */
    lcl = new CTcSymLocal(sym, len, copy_str, TRUE, formal_num);

    /* add it to the table */
    add_entry(lcl);

    /* return the new symbol */
    return lcl;
}